

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_add_filter(bcf_hdr_t *hdr,bcf1_t *line,int flt_id)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  if ((line->unpacked & 2) == 0) {
    bcf_unpack(line,2);
  }
  iVar2 = (line->d).n_flt;
  uVar7 = (ulong)iVar2;
  bVar9 = 0 < (long)uVar7;
  if (0 < (long)uVar7) {
    piVar4 = (line->d).flt;
    if (*piVar4 != flt_id) {
      uVar8 = 0;
      do {
        if (uVar7 - 1 == uVar8) goto LAB_00124207;
        uVar1 = uVar8 + 1;
        lVar3 = uVar8 + 1;
        uVar8 = uVar1;
      } while (piVar4[lVar3] != flt_id);
      bVar9 = uVar1 < uVar7;
    }
    if (bVar9) {
      return 0;
    }
  }
LAB_00124207:
  piVar4 = &(line->d).shared_dirty;
  *(byte *)piVar4 = (byte)*piVar4 | 4;
  iVar5 = 1;
  if ((flt_id != 0) && ((iVar2 != 1 || (*(line->d).flt != 0)))) {
    iVar5 = iVar2 + 1;
  }
  (line->d).n_flt = iVar5;
  if ((line->d).m_flt < iVar5) {
    uVar6 = (int)(iVar5 - 1U) >> 1 | iVar5 - 1U;
    uVar6 = (int)uVar6 >> 2 | uVar6;
    uVar6 = (int)uVar6 >> 4 | uVar6;
    uVar6 = (int)uVar6 >> 8 | uVar6;
    uVar6 = (int)uVar6 >> 0x10 | uVar6;
    (line->d).m_flt = uVar6 + 1;
    piVar4 = (int *)realloc((line->d).flt,(long)(int)uVar6 * 4 + 4);
    (line->d).flt = piVar4;
  }
  (line->d).flt[(long)(line->d).n_flt + -1] = flt_id;
  return 1;
}

Assistant:

int bcf_add_filter(const bcf_hdr_t *hdr, bcf1_t *line, int flt_id)
{
    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    int i;
    for (i=0; i<line->d.n_flt; i++)
        if ( flt_id==line->d.flt[i] ) break;
    if ( i<line->d.n_flt ) return 0;    // this filter is already set
    line->d.shared_dirty |= BCF1_DIRTY_FLT;
    if ( flt_id==0 )    // set to PASS
        line->d.n_flt = 1;
    else if ( line->d.n_flt==1 && line->d.flt[0]==0 )
        line->d.n_flt = 1;
    else
        line->d.n_flt++;
    hts_expand(int, line->d.n_flt, line->d.m_flt, line->d.flt);
    line->d.flt[line->d.n_flt-1] = flt_id;
    return 1;
}